

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppearanceConfigTab.cpp
# Opt level: O2

void __thiscall AppearanceConfigTab::chooseFont(AppearanceConfigTab *this)

{
  Fonts font_00;
  int iVar1;
  QObject *object;
  QPushButton **ppQVar2;
  QFont *pQVar3;
  int index;
  bool ok;
  QFont font;
  QPushButton *button;
  QArrayDataPointer<char16_t> local_40;
  
  object = (QObject *)QObject::sender();
  button = qobject_cast<QPushButton*>(object);
  if (button != (QPushButton *)0x0) {
    ppQVar2 = std::__find_if<QPushButton**,__gnu_cxx::__ops::_Iter_equals_val<QPushButton*const>>
                        (&this->mFontChooseButtons,&this->mDefaultButton,&button);
    if (ppQVar2 != &this->mDefaultButton) {
      index = (int)((ulong)((long)ppQVar2 - (long)&this->mFontChooseButtons) >> 3);
      font_00 = *(Fonts *)(&DAT_001f6050 + (long)index * 0x10);
      pQVar3 = FontTable::operator[](this->mFonts,font_00);
      tr((QString *)&local_40,"Select a font",(char *)0x0,-1);
      QFontDialog::getFont(&font,&ok,pQVar3,this,&local_40,0x12);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      if (ok == true) {
        iVar1 = QFont::pointSize();
        if (0x16 < iVar1) {
          QFont::setPointSize((int)&font);
        }
        FontTable::set(this->mFonts,font_00,&font);
        updateFontButton(this,index);
        ConfigTab::setDirty<(Config::Category)2>(&this->super_ConfigTab);
      }
      QFont::~QFont(&font);
    }
  }
  return;
}

Assistant:

void AppearanceConfigTab::chooseFont() {
    auto button = qobject_cast<QPushButton*>(sender());
    if (button) {
        auto iter = std::find(mFontChooseButtons.begin(), mFontChooseButtons.end(), button);
        if (iter != mFontChooseButtons.end()) {
            int index = iter - mFontChooseButtons.begin();
            auto const& meta = TU::FontButtonMetas[index];

            bool ok;
            auto font = QFontDialog::getFont(
                &ok,
                mFonts[meta.index],
                this,
                tr("Select a font"),
                QFontDialog::DontUseNativeDialog | QFontDialog::MonospacedFonts
            );

            if (ok) {
                if (font.pointSize() > TU::MAX_POINT_SIZE) {
                    font.setPointSize(TU::MAX_POINT_SIZE);
                }

                mFonts.set(meta.index, font);
                updateFontButton(index);
                setDirty<Config::CategoryAppearance>();
            }

        }
    }
}